

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pine.cc
# Opt level: O0

void __thiscall OB::Pine::Pine(Pine *this)

{
  Pine *this_local;
  
  std::__cxx11::string::string((string *)this);
  Flags::Flags(&this->flg);
  std::vector<OB::Pine::Instruction,_std::allocator<OB::Pine::Instruction>_>::vector(&this->stk);
  std::vector<int,_std::allocator<int>_>::vector(&this->cst);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Pine::Label,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Pine::Label>_>_>
  ::map(&this->lbl);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Pine::Instruction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Pine::Instruction>_>_>
  ::map(&this->smap);
  return;
}

Assistant:

Pine::Pine()
  {
  }